

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttribute<std::vector<int,_std::allocator<int>_>_>::TypedAttribute
          (TypedAttribute<std::vector<int,_std::allocator<int>_>_> *this)

{
  TypedAttribute<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  this->_value_empty = false;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::optional(&this->_attrib)
  ;
  this->_blocked = false;
  return;
}

Assistant:

TypedAttribute() = default;